

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantics.c
# Opt level: O0

void SEM_RETURN(ast *node)

{
  int iVar1;
  attr *paVar2;
  long in_RDI;
  attr *b;
  attr *fun;
  char *in_stack_00000040;
  ast *in_stack_00000058;
  attr *in_stack_00000060;
  attr *in_stack_00000068;
  
  findfunc(in_stack_00000040);
  paVar2 = SEM_Exp(in_stack_00000058);
  if ((paVar2 != (attr *)0x0) && (iVar1 = isequal(in_stack_00000068,in_stack_00000060), iVar1 == 0))
  {
    semerror(8,(int)(ulong)**(uint **)(in_RDI + 0x30),semErrorMsg[8]);
  }
  return;
}

Assistant:

static void SEM_RETURN(struct ast *node) {
    struct attr *fun = findfunc(cur_func);
    if (fun)
        fun = fun->function->return_type;
    struct attr *b = SEM_Exp(node);
    if (b && !isequal(fun, b)) { //DONETODO: error not match
//        printf("error return type\n");
        SEMERROR_NOVA(ReturnMismatch, node);
    }
}